

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall OpticsParser::Parser::parseAERCID(Parser *this,string *line,ProductData *product)

{
  int iVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  void *pvVar4;
  int *piVar5;
  ulong uVar6;
  size_type __pos;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  char *local_30;
  
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (line,"AERC",0,4);
  if (sVar3 == 0xffffffffffffffff) {
    return;
  }
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (line,"ID:",0,3);
  __pos = 0xffffffffffffffff;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_50,line,sVar3 + 3,0xffffffffffffffff);
  _Var2._M_p = local_50._M_dataplus._M_p;
  if (local_50._M_string_length != 0) {
    pvVar4 = memchr(local_50._M_dataplus._M_p,0x7d,local_50._M_string_length);
    __pos = -(ulong)(pvVar4 == (void *)0x0) | (long)pvVar4 - (long)_Var2._M_p;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            (&local_50,__pos,1);
  _Var2._M_p = local_50._M_dataplus._M_p;
  piVar5 = __errno_location();
  iVar1 = *piVar5;
  *piVar5 = 0;
  uVar6 = strtol(_Var2._M_p,&local_30,10);
  if (local_30 == _Var2._M_p) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((long)(int)uVar6 == uVar6) && (*piVar5 != 0x22)) {
    if (*piVar5 == 0) {
      *piVar5 = iVar1;
    }
    (product->aercID).super__Optional_base<int,_true,_true>._M_payload.
    super__Optional_payload_base<int> =
         (_Optional_payload_base<int>)(uVar6 & 0xffffffff | 0x100000000);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return;
    }
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    return;
  }
  std::__throw_out_of_range("stoi");
}

Assistant:

void Parser::parseAERCID(const std::string & line, ProductData & product)
    {
        if(line.find("AERC") != std::string::npos)
        {
            std::string str = line.substr(line.find("ID:") + 3);
            auto erasePos = str.find('}');
            str.erase(erasePos, 1);
            product.aercID = std::stoi(str);
        }
    }